

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

PluginManager * beagle::plugin::PluginManager::instance(void)

{
  PluginManager *pPVar1;
  
  if (ms_instance == (PluginManager *)0x0) {
    pPVar1 = (PluginManager *)operator_new(0x30);
    PluginManager((PluginManager *)0x132d2a);
    ms_instance = pPVar1;
  }
  return ms_instance;
}

Assistant:

PluginManager& PluginManager::instance()
{
    if (! ms_instance)
    ms_instance = new PluginManager();
    return *ms_instance;
}